

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

void __thiscall
flatbuffers::dart::DartGenerator::StructBuilderBody
          (DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields,string *code)

{
  Namespace *current_namespace;
  undefined8 def;
  bool bVar1;
  pointer ppVar2;
  Type *type;
  pointer ppVar3;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  string field_name_1;
  FieldDef *field_1;
  const_reverse_iterator it_1;
  __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  undefined1 local_60 [8];
  string field_name;
  FieldDef *field;
  __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
  local_30;
  const_iterator it;
  string *code_local;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *non_deprecated_fields_local;
  StructDef *struct_def_local;
  DartGenerator *this_local;
  
  it._M_current = (pair<int,_flatbuffers::FieldDef_*> *)code;
  std::__cxx11::string::operator+=((string *)code,"  int finish(");
  local_30._M_current =
       (pair<int,_flatbuffers::FieldDef_*> *)
       std::
       vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
       ::begin(non_deprecated_fields);
  while( true ) {
    field = (FieldDef *)
            std::
            vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
            ::end(non_deprecated_fields);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
                        *)&field);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
             ::operator->(&local_30);
    field_name.field_2._8_8_ = ppVar2->second;
    IdlNamer::Field_abi_cxx11_
              ((string *)local_60,&this->namer_,(FieldDef *)field_name.field_2._8_8_);
    bVar1 = IsStruct((Type *)(field_name.field_2._8_8_ + 200));
    def = field_name.field_2._8_8_;
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)it._M_current,"fb.StructBuilder");
    }
    else {
      type = (Type *)(field_name.field_2._8_8_ + 200);
      current_namespace = (struct_def->super_Definition).defined_namespace;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b1);
      GenDartTypeName(&local_90,this,type,current_namespace,(FieldDef *)def,&local_b0);
      std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
    }
    std::operator+(&local_d8," ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    it_1.current._M_current =
         std::
         vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
         ::end(non_deprecated_fields);
    local_e0 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
               ::operator-(&it_1.current,1);
    bVar1 = __gnu_cxx::operator!=(&local_30,&stack0xffffffffffffff20);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)it._M_current,", ");
    }
    std::__cxx11::string::~string((string *)local_60);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
    ::operator++(&local_30);
  }
  std::__cxx11::string::operator+=((string *)it._M_current,") {\n");
  std::
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  ::rbegin((vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
            *)&stack0xffffffffffffff10);
  while( true ) {
    std::
    vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
    ::rend((vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
            *)&field_1);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>_>
                             *)&stack0xffffffffffffff10,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>_>
                             *)&field_1);
    if (!bVar1) break;
    ppVar3 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>_>
                           *)&stack0xffffffffffffff10);
    field_name_1.field_2._8_8_ = ppVar3->second;
    IdlNamer::Field_abi_cxx11_
              ((string *)local_120,&this->namer_,(FieldDef *)field_name_1.field_2._8_8_);
    if (*(long *)(field_name_1.field_2._8_8_ + 0x128) != 0) {
      NumToString<unsigned_long>(&local_180,*(unsigned_long *)(field_name_1.field_2._8_8_ + 0x128));
      std::operator+(&local_160,"    fbBuilder.pad(",&local_180);
      std::operator+(&local_140,&local_160,");\n");
      std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
    }
    bVar1 = IsStruct((Type *)(field_name_1.field_2._8_8_ + 200));
    if (bVar1) {
      std::operator+(&local_1c0,"    ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120)
      ;
      std::operator+(&local_1a0,&local_1c0,"();\n");
      std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
    }
    else {
      GenType_abi_cxx11_(&local_220,this,(Type *)(field_name_1.field_2._8_8_ + 200));
      std::operator+(&local_200,"    fbBuilder.put",&local_220);
      std::operator+(&local_1e0,&local_200,"(");
      std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::operator+=((string *)it._M_current,(string *)local_120);
      if (*(long *)(field_name_1.field_2._8_8_ + 0xd8) != 0) {
        std::__cxx11::string::operator+=((string *)it._M_current,".value");
      }
      std::__cxx11::string::operator+=((string *)it._M_current,");\n");
    }
    std::__cxx11::string::~string((string *)local_120);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>_>
                  *)&stack0xffffffffffffff10);
  }
  std::__cxx11::string::operator+=((string *)it._M_current,"    return fbBuilder.offset;\n");
  std::__cxx11::string::operator+=((string *)it._M_current,"  }\n\n");
  return;
}

Assistant:

void StructBuilderBody(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields,
      std::string &code) {
    code += "  int finish(";
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;
      const std::string field_name = namer_.Field(field);

      if (IsStruct(field.value.type)) {
        code += "fb.StructBuilder";
      } else {
        code += GenDartTypeName(field.value.type, struct_def.defined_namespace,
                                field);
      }
      code += " " + field_name;
      if (it != non_deprecated_fields.end() - 1) { code += ", "; }
    }
    code += ") {\n";

    for (auto it = non_deprecated_fields.rbegin();
         it != non_deprecated_fields.rend(); ++it) {
      const FieldDef &field = *it->second;
      const std::string field_name = namer_.Field(field);

      if (field.padding) {
        code += "    fbBuilder.pad(" + NumToString(field.padding) + ");\n";
      }

      if (IsStruct(field.value.type)) {
        code += "    " + field_name + "();\n";
      } else {
        code += "    fbBuilder.put" + GenType(field.value.type) + "(";
        code += field_name;
        if (field.value.type.enum_def) { code += ".value"; }
        code += ");\n";
      }
    }
    code += "    return fbBuilder.offset;\n";
    code += "  }\n\n";
  }